

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

LazyJSONString *
Js::JSONStringifier::Stringify(ScriptContext *scriptContext,Var value,Var replacer,Var space)

{
  JavascriptLibrary *pJVar1;
  bool bVar2;
  charcount_t gapLength;
  Cache *pCVar3;
  ScriptContextPolymorphicInlineCache **ppSVar4;
  ScriptContextPolymorphicInlineCache *ptr;
  Recycler *pRVar5;
  JSONProperty *pJVar6;
  JavascriptString *key;
  ScriptContext *this;
  char16 *gap;
  StaticType *type;
  TrackAllocData local_f8;
  PropertyId local_cc;
  DynamicObject *pDStack_c8;
  PropertyId propertyId;
  DynamicObject *wrapper;
  JSONStringifier stringifier;
  JSONObjectStack objStack;
  TrackAllocData local_70;
  JSONProperty *local_48;
  JSONProperty *prop;
  JavascriptLibrary *library;
  Recycler *recycler;
  Var space_local;
  Var replacer_local;
  Var value_local;
  ScriptContext *scriptContext_local;
  
  recycler = (Recycler *)space;
  space_local = replacer;
  replacer_local = value;
  value_local = scriptContext;
  library = (JavascriptLibrary *)ScriptContext::GetRecycler(scriptContext);
  prop = (JSONProperty *)ScriptContext::GetLibrary((ScriptContext *)value_local);
  pCVar3 = ScriptContext::Cache((ScriptContext *)value_local);
  ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContextPolymorphicInlineCache__
                      ((WriteBarrierPtr *)&pCVar3->toJSONCache);
  if (*ppSVar4 == (ScriptContextPolymorphicInlineCache *)0x0) {
    ptr = ScriptContextPolymorphicInlineCache::New(0x20,(JavascriptLibrary *)prop);
    pCVar3 = ScriptContext::Cache((ScriptContext *)value_local);
    Memory::WriteBarrierPtr<Js::ScriptContextPolymorphicInlineCache>::operator=
              (&pCVar3->toJSONCache,ptr);
  }
  pJVar1 = library;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&JSONProperty::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
             ,0xb3);
  pRVar5 = Memory::Recycler::TrackAllocInfo((Recycler *)pJVar1,&local_70);
  pJVar6 = (JSONProperty *)new<Memory::Recycler>(0x18,pRVar5,0x43c4b0);
  JSONProperty::JSONProperty(pJVar6);
  local_48 = pJVar6;
  memset(&stringifier.gap,0,0x10);
  JSONStringifier((JSONStringifier *)&wrapper,(ScriptContext *)value_local);
  ReadReplacer((JSONStringifier *)&wrapper,space_local);
  ReadSpace((JSONStringifier *)&wrapper,recycler);
  pDStack_c8 = (DynamicObject *)0x0;
  bVar2 = HasReplacerFunction((JSONStringifier *)&wrapper);
  if (bVar2) {
    pDStack_c8 = JavascriptLibrary::CreateObject((JavascriptLibrary *)prop,false,0);
    local_cc = ScriptContext::GetEmptyStringPropertyId((ScriptContext *)value_local);
    Js::JavascriptOperators::InitProperty
              (&pDStack_c8->super_RecyclableObject,local_cc,replacer_local,PropertyOperation_None);
  }
  key = JavascriptLibrary::GetEmptyString((JavascriptLibrary *)prop);
  ReadProperty((JSONStringifier *)&wrapper,key,&pDStack_c8->super_RecyclableObject,local_48,
               replacer_local,(JSONObjectStack *)&stringifier.gap);
  pJVar1 = library;
  if (local_48->type == Undefined) {
    scriptContext_local = (ScriptContext *)0x0;
  }
  else {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_f8,(type_info *)&LazyJSONString::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
               ,0xd8);
    pRVar5 = Memory::Recycler::TrackAllocInfo((Recycler *)pJVar1,&local_f8);
    this = (ScriptContext *)new<Memory::Recycler>(0x30,pRVar5,0x43c4b0);
    pJVar6 = local_48;
    gap = GetGap((JSONStringifier *)&wrapper);
    gapLength = GetGapLength((JSONStringifier *)&wrapper);
    type = JavascriptLibrary::GetStringTypeStatic((JavascriptLibrary *)prop);
    LazyJSONString::LazyJSONString
              ((LazyJSONString *)this,pJVar6,(charcount_t)stringifier.propertyList,gap,gapLength,
               type);
    scriptContext_local = this;
  }
  return (LazyJSONString *)scriptContext_local;
}

Assistant:

LazyJSONString*
JSONStringifier::Stringify(_In_ ScriptContext* scriptContext, _In_ Var value, _In_opt_ Var replacer, _In_opt_ Var space)
{
    Recycler* recycler = scriptContext->GetRecycler();
    JavascriptLibrary* library = scriptContext->GetLibrary();

    if (scriptContext->Cache()->toJSONCache == nullptr)
    {
        scriptContext->Cache()->toJSONCache = ScriptContextPolymorphicInlineCache::New(32, library);
    }

    JSONProperty* prop = RecyclerNewStruct(recycler, JSONProperty);
    JSONObjectStack objStack = { 0 };

    JSONStringifier stringifier(scriptContext);

    stringifier.ReadReplacer(replacer);
    stringifier.ReadSpace(space);

    DynamicObject* wrapper = nullptr;
    if (stringifier.HasReplacerFunction())
    {
        // ReplacerFunction takes wrapper object as a parameter, so we need to materialize it (otherwise it isn't needed)
        wrapper = library->CreateObject();
        PropertyId propertyId = scriptContext->GetEmptyStringPropertyId();
        JavascriptOperators::InitProperty(wrapper, propertyId, value);
    }

    stringifier.ReadProperty(
        library->GetEmptyString(),
        wrapper,
        prop,
        value,
        &objStack);

    if (prop->type == JSONContentType::Undefined)
    {
        return nullptr;
    }
    else
    {
        return RecyclerNew(
            recycler,
            LazyJSONString,
            prop,
            stringifier.totalStringLength,
            stringifier.GetGap(),
            stringifier.GetGapLength(),
            library->GetStringTypeStatic());
    }
}